

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::ProcessIntersectList(Clipper *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  IntersectNode *pIVar3;
  size_t i;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    ppIVar1 = (this->m_IntersectList).
              super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppIVar2 = (this->m_IntersectList).
              super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppIVar2 - (long)ppIVar1 >> 3) <= uVar4) break;
    pIVar3 = ppIVar1[uVar4];
    IntersectEdges(this,pIVar3->Edge1,pIVar3->Edge2,&pIVar3->Pt);
    ClipperBase::SwapPositionsInAEL
              ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
               pIVar3->Edge1,pIVar3->Edge2);
    operator_delete(pIVar3,0x20);
    uVar4 = uVar4 + 1;
  }
  if (ppIVar2 != ppIVar1) {
    (this->m_IntersectList).
    super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppIVar1;
  }
  return;
}

Assistant:

void Clipper::ProcessIntersectList()
{
  for (size_t i = 0; i < m_IntersectList.size(); ++i)
  {
    IntersectNode* iNode = m_IntersectList[i];
    {
      IntersectEdges( iNode->Edge1, iNode->Edge2, iNode->Pt);
      SwapPositionsInAEL( iNode->Edge1 , iNode->Edge2 );
    }
    delete iNode;
  }
  m_IntersectList.clear();
}